

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode expect100(Curl_easy *data,connectdata *conn,Curl_send_buffer *req_buffer)

{
  _Bool _Var1;
  char *headerline;
  char *ptr;
  Curl_send_buffer *pCStack_20;
  CURLcode result;
  Curl_send_buffer *req_buffer_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  ptr._4_4_ = CURLE_OK;
  (data->state).expect100header = false;
  pCStack_20 = req_buffer;
  req_buffer_local = (Curl_send_buffer *)conn;
  conn_local = (connectdata *)data;
  _Var1 = use_http_1_1plus(data,conn);
  if ((_Var1) && ((int)req_buffer_local[0x17].size_max != 0x14)) {
    headerline = Curl_checkheaders((connectdata *)req_buffer_local,"Expect");
    if (headerline == (char *)0x0) {
      ptr._4_4_ = Curl_add_bufferf(&stack0xffffffffffffffe0,"Expect: 100-continue\r\n");
      if (ptr._4_4_ == CURLE_OK) {
        *(undefined1 *)((long)&conn_local[2].proto + 0x58) = 1;
      }
    }
    else {
      _Var1 = Curl_compareheader(headerline,"Expect:","100-continue");
      *(_Bool *)((long)&conn_local[2].proto + 0x58) = _Var1;
    }
  }
  return ptr._4_4_;
}

Assistant:

static CURLcode expect100(struct Curl_easy *data,
                          struct connectdata *conn,
                          Curl_send_buffer *req_buffer)
{
  CURLcode result = CURLE_OK;
  data->state.expect100header = FALSE; /* default to false unless it is set
                                          to TRUE below */
  if(use_http_1_1plus(data, conn) &&
     (conn->httpversion != 20)) {
    /* if not doing HTTP 1.0 or version 2, or disabled explicitly, we add an
       Expect: 100-continue to the headers which actually speeds up post
       operations (as there is one packet coming back from the web server) */
    const char *ptr = Curl_checkheaders(conn, "Expect");
    if(ptr) {
      data->state.expect100header =
        Curl_compareheader(ptr, "Expect:", "100-continue");
    }
    else {
      result = Curl_add_bufferf(&req_buffer,
                                "Expect: 100-continue\r\n");
      if(!result)
        data->state.expect100header = TRUE;
    }
  }

  return result;
}